

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall
tetgenmesh::tri_edge_2d
          (tetgenmesh *this,point A,point B,point C,point P,point Q,point R,int level,int *types,
          int *pos)

{
  char cVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double len;
  double n [3];
  int z1;
  double s4;
  double s3;
  double s2;
  double s1;
  double sC;
  double sB;
  double sA;
  double abovept [3];
  int pv [3];
  int pu [3];
  point V [3];
  point local_58;
  point U [3];
  point Q_local;
  point P_local;
  point C_local;
  point B_local;
  point A_local;
  tetgenmesh *this_local;
  
  if (R == (point)0x0) {
    facenormal(this,A,B,C,&len,1,(double *)0x0);
    dVar2 = dot(this,&len,&len);
    dVar2 = sqrt(dVar2);
    if ((dVar2 == 0.0) && (!NAN(dVar2))) {
      return 0;
    }
    len = len / dVar2;
    n[0] = n[0] / dVar2;
    n[1] = n[1] / dVar2;
    dVar2 = distance(this,A,B);
    dVar3 = distance(this,B,C);
    dVar4 = distance(this,C,A);
    dVar2 = (dVar4 + dVar3 + dVar2) / 3.0;
    R = &sA;
    sA = dVar2 * len + *A;
    abovept[0] = dVar2 * n[0] + A[1];
    abovept[1] = dVar2 * n[1] + A[2];
  }
  dVar2 = orient3d(P,Q,R,A);
  dVar3 = orient3d(P,Q,R,B);
  dVar4 = orient3d(P,Q,R,C);
  pu._4_8_ = P;
  V[0] = P;
  local_58 = A;
  U[0] = A;
  U[1] = A;
  if (0.0 <= dVar2) {
    if (dVar2 <= 0.0) {
      if (0.0 <= dVar3) {
        if (dVar3 <= 0.0) {
          if (0.0 <= dVar4) {
            if (dVar4 <= 0.0) {
              cVar1 = '\x04';
            }
            else {
              cVar1 = '\x03';
            }
            abovept[2]._4_4_ = 1;
            abovept[2]._0_4_ = 0;
            V[0] = Q;
          }
          else {
            abovept[2]._0_4_ = 1;
            abovept[2]._4_4_ = 0;
            cVar1 = '\x03';
            pu._4_8_ = Q;
          }
          pu[0] = 2;
          pv[2] = 1;
          pv[1] = 0;
          U[0] = B;
          U[1] = C;
        }
        else if (0.0 <= dVar4) {
          abovept[2]._4_1_ = dVar4 <= 0.0;
          if (abovept[2]._4_1_) {
            pv[1] = 2;
            pv[2] = 0;
            cVar1 = '\x03';
            V[0] = Q;
            local_58 = C;
            U[1] = B;
          }
          else {
            pv[1] = 1;
            pv[2] = 2;
            cVar1 = '\x01';
            pu._4_8_ = Q;
            local_58 = B;
            U[0] = C;
          }
          pu[0] = (int)abovept[2]._4_1_;
          abovept[2]._5_3_ = 0;
          abovept[2]._1_3_ = 0;
          abovept[2]._0_1_ = !abovept[2]._4_1_;
        }
        else {
          pv[1] = 0;
          pv[2] = 1;
          pu[0] = 2;
          abovept[2]._0_4_ = 1;
          abovept[2]._4_4_ = 0;
          cVar1 = '\x02';
          pu._4_8_ = Q;
          U[0] = B;
          U[1] = C;
        }
      }
      else if (0.0 <= dVar4) {
        abovept[2]._0_1_ = dVar4 <= 0.0;
        if (abovept[2]._0_1_) {
          pv[1] = 2;
          pu[0] = 1;
          cVar1 = '\x03';
          pu._4_8_ = Q;
          local_58 = C;
          U[1] = B;
        }
        else {
          pv[1] = 0;
          pu[0] = 2;
          cVar1 = '\x02';
          V[0] = Q;
          U[0] = B;
          U[1] = C;
        }
        pv[2] = (int)!abovept[2]._0_1_;
        abovept[2]._5_3_ = 0;
        abovept[2]._4_1_ = !abovept[2]._0_1_;
        abovept[2]._1_3_ = 0;
      }
      else {
        pv[1] = 1;
        pv[2] = 2;
        pu[0] = 0;
        abovept[2]._0_4_ = 0;
        abovept[2]._4_4_ = 1;
        cVar1 = '\x01';
        V[0] = Q;
        local_58 = B;
        U[0] = C;
      }
    }
    else if (0.0 <= dVar3) {
      if (dVar3 <= 0.0) {
        if (0.0 <= dVar4) {
          abovept[2]._4_1_ = dVar4 <= 0.0;
          if (abovept[2]._4_1_) {
            pv[1] = 1;
            pv[2] = 2;
            cVar1 = '\x03';
            V[0] = Q;
            local_58 = B;
            U[0] = C;
          }
          else {
            pv[1] = 2;
            pv[2] = 0;
            cVar1 = '\x01';
            pu._4_8_ = Q;
            local_58 = C;
            U[1] = B;
          }
          pu[0] = (int)!abovept[2]._4_1_;
          abovept[2]._5_3_ = 0;
          abovept[2]._1_3_ = 0;
          abovept[2]._0_1_ = !abovept[2]._4_1_;
        }
        else {
          pv[1] = 1;
          pv[2] = 2;
          pu[0] = 0;
          abovept[2]._0_4_ = 0;
          abovept[2]._4_4_ = 1;
          cVar1 = '\x02';
          V[0] = Q;
          local_58 = B;
          U[0] = C;
        }
      }
      else {
        if (0.0 <= dVar4) {
          if (0.0 < dVar4) {
            return 0;
          }
          cVar1 = '\x01';
        }
        else {
          cVar1 = '\0';
        }
        pu[0] = 2;
        pv[2] = 1;
        pv[1] = 0;
        abovept[2]._4_4_ = 0;
        abovept[2]._0_4_ = 1;
        pu._4_8_ = Q;
        U[0] = B;
        U[1] = C;
      }
    }
    else if (0.0 <= dVar4) {
      if (dVar4 <= 0.0) {
        cVar1 = '\x02';
      }
      else {
        cVar1 = '\0';
      }
      pu[0] = 1;
      pv[2] = 0;
      pv[1] = 2;
      abovept[2]._4_4_ = 0;
      abovept[2]._0_4_ = 1;
      pu._4_8_ = Q;
      local_58 = C;
      U[1] = B;
    }
    else {
      pv[1] = 1;
      pv[2] = 2;
      pu[0] = 0;
      abovept[2]._0_4_ = 0;
      abovept[2]._4_4_ = 1;
      cVar1 = '\0';
      V[0] = Q;
      local_58 = B;
      U[0] = C;
    }
  }
  else if (0.0 <= dVar3) {
    if (dVar3 <= 0.0) {
      if (0.0 <= dVar4) {
        if (dVar4 <= 0.0) {
          cVar1 = '\x03';
        }
        else {
          cVar1 = '\x02';
        }
        pu[0] = 0;
        pv[2] = 2;
        pv[1] = 1;
        abovept[2]._4_4_ = 0;
        abovept[2]._0_4_ = 1;
        pu._4_8_ = Q;
        local_58 = B;
        U[0] = C;
      }
      else {
        pv[1] = 2;
        pv[2] = 0;
        pu[0] = 1;
        abovept[2]._0_4_ = 0;
        abovept[2]._4_4_ = 1;
        cVar1 = '\x01';
        V[0] = Q;
        local_58 = C;
        U[1] = B;
      }
    }
    else if (0.0 <= dVar4) {
      abovept[2]._4_1_ = dVar4 <= 0.0;
      if (abovept[2]._4_1_) {
        pv[1] = 2;
        pv[2] = 0;
        cVar1 = '\x02';
        V[0] = Q;
        local_58 = C;
        U[1] = B;
      }
      else {
        pv[1] = 1;
        pv[2] = 2;
        cVar1 = '\0';
        pu._4_8_ = Q;
        local_58 = B;
        U[0] = C;
      }
      pu[0] = (int)abovept[2]._4_1_;
      abovept[2]._5_3_ = 0;
      abovept[2]._1_3_ = 0;
      abovept[2]._0_1_ = !abovept[2]._4_1_;
    }
    else {
      pv[1] = 2;
      pv[2] = 0;
      pu[0] = 1;
      abovept[2]._0_4_ = 0;
      abovept[2]._4_4_ = 1;
      cVar1 = '\0';
      V[0] = Q;
      local_58 = C;
      U[1] = B;
    }
  }
  else {
    if (dVar4 < 0.0) {
      return 0;
    }
    cVar1 = dVar4 <= 0.0;
    pu[0] = 2;
    pv[2] = 1;
    pv[1] = 0;
    abovept[2]._4_4_ = 1;
    abovept[2]._0_4_ = 0;
    V[0] = Q;
    U[0] = B;
    U[1] = C;
  }
  dVar2 = orient3d(local_58,U[1],R,V[0]);
  dVar3 = orient3d(U[0],U[1],R,(double *)pu._4_8_);
  if (dVar2 <= 0.0) {
    if (0.0 <= dVar3) {
      if (level == 0) {
        this_local._4_4_ = 1;
      }
      else if (cVar1 == '\x01') {
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          if ((dVar3 != 0.0) || (NAN(dVar3))) {
            *types = 7;
            *pos = pu[0];
            pos[1] = abovept[2]._0_4_;
            types[1] = 0;
          }
          else {
            *types = 2;
            *pos = pu[0];
            pos[1] = abovept[2]._0_4_;
            types[1] = 0;
          }
        }
        else {
          *types = 2;
          *pos = pu[0];
          pos[1] = abovept[2]._4_4_;
          types[1] = 0;
        }
        this_local._4_4_ = 4;
      }
      else {
        dVar4 = orient3d(local_58,U[1],R,(double *)pu._4_8_);
        dVar5 = orient3d(U[0],U[1],R,V[0]);
        if (cVar1 == '\0') {
          if (0.0 <= dVar2) {
            *types = 5;
            *pos = pu[0];
            pos[1] = abovept[2]._4_4_;
            types[1] = 0;
          }
          else if (dVar4 <= 0.0) {
            if ((dVar4 != 0.0) || (NAN(dVar4))) {
              if (dVar3 <= 0.0) {
                *types = 5;
                *pos = pv[2];
                pos[1] = abovept[2]._0_4_;
                types[1] = 0;
              }
              else if (dVar5 <= 0.0) {
                if ((dVar5 != 0.0) || (NAN(dVar5))) {
                  *types = 6;
                  *pos = 3;
                  pos[1] = abovept[2]._0_4_;
                  types[1] = 8;
                  pos[2] = pv[2];
                  pos[3] = abovept[2]._0_4_;
                }
                else {
                  *types = 6;
                  *pos = 3;
                  pos[1] = abovept[2]._0_4_;
                  types[1] = 5;
                  pos[2] = pv[2];
                  pos[3] = abovept[2]._4_4_;
                }
              }
              else {
                *types = 6;
                *pos = 3;
                pos[1] = abovept[2]._0_4_;
                types[1] = 6;
                pos[2] = 3;
                pos[3] = abovept[2]._4_4_;
              }
            }
            else if (dVar5 <= 0.0) {
              if ((dVar5 != 0.0) || (NAN(dVar5))) {
                *types = 5;
                *pos = pu[0];
                pos[1] = abovept[2]._0_4_;
                types[1] = 8;
                pos[2] = pv[2];
                pos[3] = abovept[2]._0_4_;
              }
              else {
                *types = 5;
                *pos = pu[0];
                pos[1] = abovept[2]._0_4_;
                types[1] = 5;
                pos[2] = pv[2];
                pos[3] = abovept[2]._4_4_;
              }
            }
            else {
              *types = 5;
              *pos = pu[0];
              pos[1] = abovept[2]._0_4_;
              types[1] = 6;
              pos[2] = 3;
              pos[3] = abovept[2]._4_4_;
            }
          }
          else if (dVar5 <= 0.0) {
            if ((dVar5 != 0.0) || (NAN(dVar5))) {
              *types = 8;
              *pos = pu[0];
              pos[1] = abovept[2]._0_4_;
              types[1] = 8;
              pos[2] = pv[2];
              pos[3] = abovept[2]._0_4_;
            }
            else {
              *types = 8;
              *pos = pu[0];
              pos[1] = abovept[2]._0_4_;
              types[1] = 5;
              pos[2] = pv[2];
              pos[3] = abovept[2]._4_4_;
            }
          }
          else {
            *types = 8;
            *pos = pu[0];
            pos[1] = abovept[2]._0_4_;
            types[1] = 6;
            pos[2] = 3;
            pos[3] = abovept[2]._4_4_;
          }
        }
        else if (cVar1 == '\x02') {
          if (0.0 <= dVar2) {
            *types = 2;
            *pos = pv[1];
            pos[1] = abovept[2]._4_4_;
            types[1] = 0;
          }
          else if (dVar4 <= 0.0) {
            if ((dVar4 != 0.0) || (NAN(dVar4))) {
              if (dVar3 <= 0.0) {
                *types = 5;
                *pos = pv[2];
                pos[1] = abovept[2]._0_4_;
                types[1] = 0;
              }
              else if (dVar5 <= 0.0) {
                if ((dVar5 != 0.0) || (NAN(dVar5))) {
                  *types = 6;
                  *pos = 3;
                  pos[1] = abovept[2]._0_4_;
                  *types = 8;
                  *pos = pv[2];
                  pos[1] = abovept[2]._0_4_;
                }
                else {
                  *types = 6;
                  *pos = 3;
                  pos[1] = abovept[2]._0_4_;
                  *types = 5;
                  *pos = pv[2];
                  pos[1] = abovept[2]._4_4_;
                }
              }
              else {
                *types = 6;
                *pos = 3;
                pos[1] = abovept[2]._0_4_;
                *types = 6;
                *pos = 3;
                pos[1] = abovept[2]._4_4_;
              }
            }
            else if (dVar5 <= 0.0) {
              if ((dVar5 != 0.0) || (NAN(dVar5))) {
                *types = 2;
                *pos = pv[1];
                pos[1] = abovept[2]._0_4_;
                types[1] = 8;
                pos[2] = pv[2];
                pos[3] = abovept[2]._0_4_;
              }
              else {
                *types = 2;
                *pos = pv[1];
                pos[1] = abovept[2]._0_4_;
                types[1] = 5;
                pos[2] = pv[2];
                pos[3] = abovept[2]._4_4_;
              }
            }
            else {
              *types = 2;
              *pos = pv[1];
              pos[1] = abovept[2]._0_4_;
              types[1] = 6;
              pos[2] = 3;
              pos[3] = abovept[2]._4_4_;
            }
          }
          else if (dVar5 <= 0.0) {
            if ((dVar5 != 0.0) || (NAN(dVar5))) {
              *types = 7;
              *pos = pv[1];
              pos[1] = abovept[2]._0_4_;
              types[1] = 8;
              pos[2] = pv[2];
              pos[3] = abovept[2]._0_4_;
            }
            else {
              *types = 7;
              *pos = pv[1];
              pos[1] = abovept[2]._0_4_;
              types[1] = 5;
              pos[2] = pv[2];
              pos[3] = abovept[2]._4_4_;
            }
          }
          else {
            *types = 7;
            *pos = pv[1];
            pos[1] = abovept[2]._0_4_;
            types[1] = 6;
            pos[2] = 3;
            pos[3] = abovept[2]._4_4_;
          }
        }
        else if (cVar1 == '\x03') {
          if (0.0 <= dVar2) {
            *types = 2;
            *pos = pv[1];
            pos[1] = abovept[2]._4_4_;
            types[1] = 0;
          }
          else if (dVar4 <= 0.0) {
            if ((dVar4 != 0.0) || (NAN(dVar4))) {
              if (dVar3 <= 0.0) {
                *types = 2;
                *pos = pv[2];
                pos[1] = abovept[2]._0_4_;
                types[1] = 0;
              }
              else if (dVar5 <= 0.0) {
                if ((dVar5 != 0.0) || (NAN(dVar5))) {
                  *types = 5;
                  *pos = pv[1];
                  pos[1] = abovept[2]._0_4_;
                  types[1] = 7;
                  pos[2] = pv[2];
                  pos[3] = abovept[2]._0_4_;
                }
                else {
                  *types = 5;
                  *pos = pv[1];
                  pos[1] = abovept[2]._0_4_;
                  types[1] = 2;
                  pos[2] = pv[2];
                  pos[3] = abovept[2]._4_4_;
                }
              }
              else {
                *types = 5;
                *pos = pv[1];
                pos[1] = abovept[2]._0_4_;
                types[1] = 5;
                pos[2] = pv[1];
                pos[3] = abovept[2]._4_4_;
              }
            }
            else if (dVar5 <= 0.0) {
              if ((dVar5 != 0.0) || (NAN(dVar5))) {
                *types = 2;
                *pos = pv[1];
                pos[1] = abovept[2]._0_4_;
                types[1] = 7;
                pos[2] = pv[2];
                pos[3] = abovept[2]._0_4_;
              }
              else {
                *types = 3;
                *pos = pv[1];
                pos[1] = abovept[2]._0_4_;
                types[1] = 0;
              }
            }
            else {
              *types = 2;
              *pos = pv[1];
              pos[1] = abovept[2]._0_4_;
              types[1] = 5;
              pos[2] = pv[1];
              pos[3] = abovept[2]._4_4_;
            }
          }
          else if (dVar5 <= 0.0) {
            if ((dVar5 != 0.0) || (NAN(dVar5))) {
              *types = 7;
              *pos = pv[1];
              pos[1] = abovept[2]._0_4_;
              types[1] = 7;
              pos[2] = pv[2];
              pos[3] = abovept[2]._0_4_;
            }
            else {
              *types = 7;
              *pos = pv[1];
              pos[1] = abovept[2]._0_4_;
              types[1] = 2;
              pos[2] = pv[2];
              pos[3] = abovept[2]._4_4_;
            }
          }
          else {
            *types = 7;
            *pos = pv[1];
            pos[1] = abovept[2]._0_4_;
            types[1] = 5;
            pos[2] = pv[1];
            pos[3] = abovept[2]._4_4_;
          }
        }
        this_local._4_4_ = 4;
      }
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int tetgenmesh::tri_edge_2d(point A, point B, point C, point P, point Q, 
                            point R, int level, int *types, int *pos)
{
  point U[3], V[3];  // The permuted vectors of points.
  int pu[3], pv[3];  // The original positions of points.
  REAL abovept[3];
  REAL sA, sB, sC;
  REAL s1, s2, s3, s4;
  int z1;

  if (R == NULL) {
    // Calculate a lift point.
    if (1) {
      REAL n[3], len;
      // Calculate a lift point, saved in dummypoint.
      facenormal(A, B, C, n, 1, NULL);
      len = sqrt(dot(n, n));
      if (len != 0) {
        n[0] /= len;
        n[1] /= len;
        n[2] /= len;
        len = distance(A, B);
        len += distance(B, C);
        len += distance(C, A);
        len /= 3.0;
        R = abovept; //dummypoint;
        R[0] = A[0] + len * n[0];
        R[1] = A[1] + len * n[1];
        R[2] = A[2] + len * n[2];
      } else {
        // The triangle [A,B,C] is (nearly) degenerate, i.e., it is (close)
        //   to a line.  We need a line-line intersection test.
        // !!! A non-save return value.!!!
        return 0;  // DISJOINT
      }
    }
  }

  // Test A's, B's, and C's orientations wrt plane PQR. 
  sA = orient3d(P, Q, R, A);
  sB = orient3d(P, Q, R, B);
  sC = orient3d(P, Q, R, C);


  if (sA < 0) {
    if (sB < 0) {
      if (sC < 0) { // (---).
        return 0; 
      } else {
        if (sC > 0) { // (--+).
          // All points are in the right positions.
          SETVECTOR3(U, A, B, C);  // I3
          SETVECTOR3(V, P, Q, R);  // I2
          SETVECTOR3(pu, 0, 1, 2);
          SETVECTOR3(pv, 0, 1, 2);
          z1 = 0;
        } else { // (--0).
          SETVECTOR3(U, A, B, C);  // I3
          SETVECTOR3(V, P, Q, R);  // I2
          SETVECTOR3(pu, 0, 1, 2);
          SETVECTOR3(pv, 0, 1, 2);
          z1 = 1;
        }
      }
    } else { 
      if (sB > 0) {
        if (sC < 0) { // (-+-).
          SETVECTOR3(U, C, A, B);  // PT = ST
          SETVECTOR3(V, P, Q, R);  // I2
          SETVECTOR3(pu, 2, 0, 1);
          SETVECTOR3(pv, 0, 1, 2);
          z1 = 0;
        } else {
          if (sC > 0) { // (-++).
            SETVECTOR3(U, B, C, A);  // PT = ST x ST
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 1, 2, 0);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 0;
          } else { // (-+0).
            SETVECTOR3(U, C, A, B);  // PT = ST
            SETVECTOR3(V, P, Q, R);  // I2
            SETVECTOR3(pu, 2, 0, 1);
            SETVECTOR3(pv, 0, 1, 2);
            z1 = 2;
          }
        }
      } else {
        if (sC < 0) { // (-0-).
          SETVECTOR3(U, C, A, B);  // PT = ST
          SETVECTOR3(V, P, Q, R);  // I2
          SETVECTOR3(pu, 2, 0, 1);
          SETVECTOR3(pv, 0, 1, 2);
          z1 = 1;
        } else {
          if (sC > 0) { // (-0+).
            SETVECTOR3(U, B, C, A);  // PT = ST x ST
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 1, 2, 0);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 2;
          } else { // (-00).
            SETVECTOR3(U, B, C, A);  // PT = ST x ST
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 1, 2, 0);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 3; 
          }
        }
      }
    }
  } else {
    if (sA > 0) {
      if (sB < 0) {
        if (sC < 0) { // (+--).
          SETVECTOR3(U, B, C, A);  // PT = ST x ST
          SETVECTOR3(V, P, Q, R);  // I2
          SETVECTOR3(pu, 1, 2, 0);
          SETVECTOR3(pv, 0, 1, 2);
          z1 = 0;
        } else {
          if (sC > 0) { // (+-+).
            SETVECTOR3(U, C, A, B);  // PT = ST
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 2, 0, 1);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 0;
          } else { // (+-0).
            SETVECTOR3(U, C, A, B);  // PT = ST
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 2, 0, 1);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 2;
          }
        }
      } else { 
        if (sB > 0) {
          if (sC < 0) { // (++-).
            SETVECTOR3(U, A, B, C);  // I3
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 0, 1, 2);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 0;
          } else {
            if (sC > 0) { // (+++).
              return 0; 
            } else { // (++0).
              SETVECTOR3(U, A, B, C);  // I3
              SETVECTOR3(V, Q, P, R);  // PL = SL
              SETVECTOR3(pu, 0, 1, 2);
              SETVECTOR3(pv, 1, 0, 2);
              z1 = 1; 
            }
          }
        } else { // (+0#)
          if (sC < 0) { // (+0-).
            SETVECTOR3(U, B, C, A);  // PT = ST x ST
            SETVECTOR3(V, P, Q, R);  // I2
            SETVECTOR3(pu, 1, 2, 0);
            SETVECTOR3(pv, 0, 1, 2);
            z1 = 2;
          } else {
            if (sC > 0) { // (+0+).
              SETVECTOR3(U, C, A, B);  // PT = ST
              SETVECTOR3(V, Q, P, R);  // PL = SL
              SETVECTOR3(pu, 2, 0, 1);
              SETVECTOR3(pv, 1, 0, 2);
              z1 = 1;
            } else { // (+00).
              SETVECTOR3(U, B, C, A);  // PT = ST x ST
              SETVECTOR3(V, P, Q, R);  // I2
              SETVECTOR3(pu, 1, 2, 0);
              SETVECTOR3(pv, 0, 1, 2);
              z1 = 3; 
            }
          }
        }
      }
    } else { 
      if (sB < 0) {
        if (sC < 0) { // (0--).
          SETVECTOR3(U, B, C, A);  // PT = ST x ST
          SETVECTOR3(V, P, Q, R);  // I2
          SETVECTOR3(pu, 1, 2, 0);
          SETVECTOR3(pv, 0, 1, 2);
          z1 = 1;
        } else {
          if (sC > 0) { // (0-+).
            SETVECTOR3(U, A, B, C);  // I3
            SETVECTOR3(V, P, Q, R);  // I2
            SETVECTOR3(pu, 0, 1, 2);
            SETVECTOR3(pv, 0, 1, 2);
            z1 = 2;
          } else { // (0-0).
            SETVECTOR3(U, C, A, B);  // PT = ST
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 2, 0, 1);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 3; 
          }
        }
      } else { 
        if (sB > 0) {
          if (sC < 0) { // (0+-).
            SETVECTOR3(U, A, B, C);  // I3
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 0, 1, 2);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 2;
          } else {
            if (sC > 0) { // (0++).
              SETVECTOR3(U, B, C, A);  // PT = ST x ST
              SETVECTOR3(V, Q, P, R);  // PL = SL
              SETVECTOR3(pu, 1, 2, 0);
              SETVECTOR3(pv, 1, 0, 2);
              z1 = 1;
            } else { // (0+0).
              SETVECTOR3(U, C, A, B);  // PT = ST
              SETVECTOR3(V, P, Q, R);  // I2
              SETVECTOR3(pu, 2, 0, 1);
              SETVECTOR3(pv, 0, 1, 2);
              z1 = 3; 
            }
          }
        } else { // (00#)
          if (sC < 0) { // (00-).
            SETVECTOR3(U, A, B, C);  // I3
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 0, 1, 2);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 3; 
          } else {
            if (sC > 0) { // (00+).
              SETVECTOR3(U, A, B, C);  // I3
              SETVECTOR3(V, P, Q, R);  // I2
              SETVECTOR3(pu, 0, 1, 2);
              SETVECTOR3(pv, 0, 1, 2);
              z1 = 3; 
            } else { // (000)
              // Not possible unless ABC is degenerate.
              // Avoiding compiler warnings.
              SETVECTOR3(U, A, B, C);  // I3
              SETVECTOR3(V, P, Q, R);  // I2
              SETVECTOR3(pu, 0, 1, 2);
              SETVECTOR3(pv, 0, 1, 2);
              z1 = 4;
            }
          }
        }
      }
    }
  }

  s1 = orient3d(U[0], U[2], R, V[1]);  // A, C, R, Q
  s2 = orient3d(U[1], U[2], R, V[0]);  // B, C, R, P

  if (s1 > 0) {
    return 0;
  }
  if (s2 < 0) {
    return 0;
  }

  if (level == 0) {
    return 1;  // They are intersected.
  }


  if (z1 == 1) {
    if (s1 == 0) {  // (0###)
      // C = Q.
      types[0] = (int) SHAREVERT;
      pos[0] = pu[2]; // C
      pos[1] = pv[1]; // Q
      types[1] = (int) DISJOINT;
    } else {
      if (s2 == 0) { // (#0##)
        // C = P.
        types[0] = (int) SHAREVERT;
        pos[0] = pu[2]; // C
        pos[1] = pv[0]; // P
        types[1] = (int) DISJOINT;
      } else { // (-+##)
        // C in [P, Q].
        types[0] = (int) ACROSSVERT;
        pos[0] = pu[2]; // C
        pos[1] = pv[0]; // [P, Q]
        types[1] = (int) DISJOINT;
      }
    }
    return 4;
  }

  s3 = orient3d(U[0], U[2], R, V[0]);  // A, C, R, P
  s4 = orient3d(U[1], U[2], R, V[1]);  // B, C, R, Q
      
  if (z1 == 0) {  // (tritri-03)
    if (s1 < 0) {
      if (s3 > 0) {
        if (s4 > 0) {
          // [P, Q] overlaps [k, l] (-+++).
          types[0] = (int) ACROSSEDGE;
          pos[0] = pu[2]; // [C, A]
          pos[1] = pv[0]; // [P, Q]
          types[1] = (int) TOUCHFACE;
          pos[2] = 3;     // [A, B, C]
          pos[3] = pv[1]; // Q
        } else {
          if (s4 == 0) {
            // Q = l, [P, Q] contains [k, l] (-++0).
            types[0] = (int) ACROSSEDGE;
            pos[0] = pu[2]; // [C, A]
            pos[1] = pv[0]; // [P, Q]
            types[1] = (int) TOUCHEDGE;
            pos[2] = pu[1]; // [B, C]
            pos[3] = pv[1]; // Q
          } else { // s4 < 0
            // [P, Q] contains [k, l] (-++-).
            types[0] = (int) ACROSSEDGE;
            pos[0] = pu[2]; // [C, A]
            pos[1] = pv[0]; // [P, Q]
            types[1] = (int) ACROSSEDGE;
            pos[2] = pu[1]; // [B, C]
            pos[3] = pv[0]; // [P, Q]
          }
        }
      } else {
        if (s3 == 0) {
          if (s4 > 0) {
            // P = k, [P, Q] in [k, l] (-+0+).
            types[0] = (int) TOUCHEDGE;
            pos[0] = pu[2]; // [C, A]
            pos[1] = pv[0]; // P
            types[1] = (int) TOUCHFACE;
            pos[2] = 3;     // [A, B, C]
            pos[3] = pv[1]; // Q
          } else {
            if (s4 == 0) {
              // [P, Q] = [k, l] (-+00).
              types[0] = (int) TOUCHEDGE;
              pos[0] = pu[2]; // [C, A]
              pos[1] = pv[0]; // P
              types[1] = (int) TOUCHEDGE;
              pos[2] = pu[1]; // [B, C]
              pos[3] = pv[1]; // Q
            } else {
              // P = k, [P, Q] contains [k, l] (-+0-).
              types[0] = (int) TOUCHEDGE;
              pos[0] = pu[2]; // [C, A]
              pos[1] = pv[0]; // P
              types[1] = (int) ACROSSEDGE;
              pos[2] = pu[1]; // [B, C]
              pos[3] = pv[0]; // [P, Q]
            }
          }
        } else { // s3 < 0
          if (s2 > 0) {
            if (s4 > 0) {
              // [P, Q] in [k, l] (-+-+).
              types[0] = (int) TOUCHFACE;
              pos[0] = 3;     // [A, B, C]
              pos[1] = pv[0]; // P
              types[1] = (int) TOUCHFACE;
              pos[2] = 3;     // [A, B, C]
              pos[3] = pv[1]; // Q
            } else {
              if (s4 == 0) {
                // Q = l, [P, Q] in [k, l] (-+-0).
                types[0] = (int) TOUCHFACE;
                pos[0] = 3;     // [A, B, C]
                pos[1] = pv[0]; // P
                types[1] = (int) TOUCHEDGE;
                pos[2] = pu[1]; // [B, C]
                pos[3] = pv[1]; // Q
              } else { // s4 < 0
                // [P, Q] overlaps [k, l] (-+--).
                types[0] = (int) TOUCHFACE;
                pos[0] = 3;     // [A, B, C]
                pos[1] = pv[0]; // P
                types[1] = (int) ACROSSEDGE;
                pos[2] = pu[1]; // [B, C]
                pos[3] = pv[0]; // [P, Q]
              }
            }
          } else { // s2 == 0
            // P = l (#0##).
            types[0] = (int) TOUCHEDGE;
            pos[0] = pu[1]; // [B, C]
            pos[1] = pv[0]; // P
            types[1] = (int) DISJOINT;
          }
        }
      }
    } else { // s1 == 0
      // Q = k (0####)
      types[0] = (int) TOUCHEDGE;
      pos[0] = pu[2]; // [C, A]
      pos[1] = pv[1]; // Q
      types[1] = (int) DISJOINT;
    }
  } else if (z1 == 2) {  // (tritri-23)
    if (s1 < 0) {
      if (s3 > 0) {
        if (s4 > 0) {
          // [P, Q] overlaps [A, l] (-+++).
          types[0] = (int) ACROSSVERT;
          pos[0] = pu[0]; // A
          pos[1] = pv[0]; // [P, Q]
          types[1] = (int) TOUCHFACE;
          pos[2] = 3;     // [A, B, C]
          pos[3] = pv[1]; // Q
        } else {
          if (s4 == 0) {
            // Q = l, [P, Q] contains [A, l] (-++0).
            types[0] = (int) ACROSSVERT;
            pos[0] = pu[0]; // A
            pos[1] = pv[0]; // [P, Q]
            types[1] = (int) TOUCHEDGE;
            pos[2] = pu[1]; // [B, C]
            pos[3] = pv[1]; // Q
          } else { // s4 < 0
            // [P, Q] contains [A, l] (-++-).
            types[0] = (int) ACROSSVERT;
            pos[0] = pu[0]; // A
            pos[1] = pv[0]; // [P, Q]
            types[1] = (int) ACROSSEDGE;
            pos[2] = pu[1]; // [B, C]
            pos[3] = pv[0]; // [P, Q]
          }
        }
      } else {
        if (s3 == 0) {
          if (s4 > 0) {
            // P = A, [P, Q] in [A, l] (-+0+).
            types[0] = (int) SHAREVERT;
            pos[0] = pu[0]; // A
            pos[1] = pv[0]; // P
            types[1] = (int) TOUCHFACE;
            pos[2] = 3;     // [A, B, C]
            pos[3] = pv[1]; // Q
          } else {
            if (s4 == 0) {
              // [P, Q] = [A, l] (-+00).
              types[0] = (int) SHAREVERT;
              pos[0] = pu[0]; // A
              pos[1] = pv[0]; // P
              types[1] = (int) TOUCHEDGE;
              pos[2] = pu[1]; // [B, C]
              pos[3] = pv[1]; // Q
            } else { // s4 < 0
              // Q = l, [P, Q] in [A, l] (-+0-).
              types[0] = (int) SHAREVERT;
              pos[0] = pu[0]; // A
              pos[1] = pv[0]; // P
              types[1] = (int) ACROSSEDGE;
              pos[2] = pu[1]; // [B, C]
              pos[3] = pv[0]; // [P, Q]
            }
          }
        } else { // s3 < 0
          if (s2 > 0) {
            if (s4 > 0) {
              // [P, Q] in [A, l] (-+-+).
              types[0] = (int) TOUCHFACE;
              pos[0] = 3;     // [A, B, C]
              pos[1] = pv[0]; // P
              types[0] = (int) TOUCHFACE;
              pos[0] = 3;     // [A, B, C]
              pos[1] = pv[1]; // Q
            } else {
              if (s4 == 0) {
                // Q = l, [P, Q] in [A, l] (-+-0).
                types[0] = (int) TOUCHFACE;
                pos[0] = 3;     // [A, B, C]
                pos[1] = pv[0]; // P
                types[0] = (int) TOUCHEDGE;
                pos[0] = pu[1]; // [B, C]
                pos[1] = pv[1]; // Q
              } else { // s4 < 0
                // [P, Q] overlaps [A, l] (-+--).
                types[0] = (int) TOUCHFACE;
                pos[0] = 3;     // [A, B, C]
                pos[1] = pv[0]; // P
                types[0] = (int) ACROSSEDGE;
                pos[0] = pu[1]; // [B, C]
                pos[1] = pv[0]; // [P, Q]
              }
            }
          } else { // s2 == 0
            // P = l (#0##).
            types[0] = (int) TOUCHEDGE;
            pos[0] = pu[1]; // [B, C]
            pos[1] = pv[0]; // P
            types[1] = (int) DISJOINT;
          }
        }
      }
    } else { // s1 == 0
      // Q = A (0###).
      types[0] = (int) SHAREVERT;
      pos[0] = pu[0]; // A
      pos[1] = pv[1]; // Q
      types[1] = (int) DISJOINT;
    }
  } else if (z1 == 3) {  // (tritri-33)
    if (s1 < 0) {
      if (s3 > 0) {
        if (s4 > 0) {
          // [P, Q] overlaps [A, B] (-+++).
          types[0] = (int) ACROSSVERT;
          pos[0] = pu[0]; // A
          pos[1] = pv[0]; // [P, Q]
          types[1] = (int) TOUCHEDGE;
          pos[2] = pu[0]; // [A, B]
          pos[3] = pv[1]; // Q
        } else {
          if (s4 == 0) {
            // Q = B, [P, Q] contains [A, B] (-++0).
            types[0] = (int) ACROSSVERT;
            pos[0] = pu[0]; // A
            pos[1] = pv[0]; // [P, Q]
            types[1] = (int) SHAREVERT;
            pos[2] = pu[1]; // B
            pos[3] = pv[1]; // Q
          } else { // s4 < 0
            // [P, Q] contains [A, B] (-++-).
            types[0] = (int) ACROSSVERT;
            pos[0] = pu[0]; // A
            pos[1] = pv[0]; // [P, Q]
            types[1] = (int) ACROSSVERT;
            pos[2] = pu[1]; // B
            pos[3] = pv[0]; // [P, Q]
          }
        }
      } else {
        if (s3 == 0) {
          if (s4 > 0) {
            // P = A, [P, Q] in [A, B] (-+0+).
            types[0] = (int) SHAREVERT;
            pos[0] = pu[0]; // A
            pos[1] = pv[0]; // P
            types[1] = (int) TOUCHEDGE;
            pos[2] = pu[0]; // [A, B]
            pos[3] = pv[1]; // Q
          } else {
            if (s4 == 0) {
              // [P, Q] = [A, B] (-+00).
              types[0] = (int) SHAREEDGE;
              pos[0] = pu[0]; // [A, B]
              pos[1] = pv[0]; // [P, Q]
              types[1] = (int) DISJOINT;
            } else { // s4 < 0
              // P= A, [P, Q] in [A, B] (-+0-).
              types[0] = (int) SHAREVERT;
              pos[0] = pu[0]; // A
              pos[1] = pv[0]; // P
              types[1] = (int) ACROSSVERT;
              pos[2] = pu[1]; // B
              pos[3] = pv[0]; // [P, Q]
            }
          }
        } else { // s3 < 0
          if (s2 > 0) {
            if (s4 > 0) {
              // [P, Q] in [A, B] (-+-+).
              types[0] = (int) TOUCHEDGE;
              pos[0] = pu[0]; // [A, B]
              pos[1] = pv[0]; // P
              types[1] = (int) TOUCHEDGE;
              pos[2] = pu[0]; // [A, B]
              pos[3] = pv[1]; // Q
            } else {
              if (s4 == 0) {
                // Q = B, [P, Q] in [A, B] (-+-0).
                types[0] = (int) TOUCHEDGE;
                pos[0] = pu[0]; // [A, B]
                pos[1] = pv[0]; // P
                types[1] = (int) SHAREVERT;
                pos[2] = pu[1]; // B
                pos[3] = pv[1]; // Q
              } else { // s4 < 0
                // [P, Q] overlaps [A, B] (-+--).
                types[0] = (int) TOUCHEDGE;
                pos[0] = pu[0]; // [A, B]
                pos[1] = pv[0]; // P
                types[1] = (int) ACROSSVERT;
                pos[2] = pu[1]; // B
                pos[3] = pv[0]; // [P, Q]
              }
            }
          } else { // s2 == 0
            // P = B (#0##).
            types[0] = (int) SHAREVERT;
            pos[0] = pu[1]; // B
            pos[1] = pv[0]; // P
            types[1] = (int) DISJOINT;
          }
        }
      }
    } else { // s1 == 0
      // Q = A (0###).
      types[0] = (int) SHAREVERT;
      pos[0] = pu[0]; // A
      pos[1] = pv[1]; // Q
      types[1] = (int) DISJOINT;
    }
  }

  return 4;
}